

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_get_bytes(CBS *cbs,CBS *out,size_t len)

{
  ulong uVar1;
  uint8_t *in_RCX;
  
  uVar1 = cbs->len;
  if (len <= uVar1) {
    in_RCX = cbs->data;
    cbs->data = in_RCX + len;
    cbs->len = uVar1 - len;
  }
  if (len <= uVar1) {
    out->data = in_RCX;
    out->len = len;
  }
  return (uint)(len <= uVar1);
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}